

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O3

int http_checkfile(char *urltype,char *infile,char *outfile1)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 uVar4;
  FILE **ppFVar5;
  FILE **infile_00;
  FILE *httpfile;
  int contentlength;
  char newinfile [1200];
  char contentencoding [1200];
  char contenttype [1200];
  FILE *local_e48;
  int local_e3c;
  char local_e38 [1200];
  undefined4 local_988;
  undefined4 uStack_984;
  char local_980;
  char local_4d8 [1200];
  
  infile_00 = &local_e48;
  ppFVar5 = &local_e48;
  local_e48 = (FILE *)0x0;
  builtin_strncpy(urltype,"http://",8);
  if (*outfile1 != '\0') {
    iVar1 = strncmp(outfile1,"file://",7);
    pcVar2 = outfile1 + 7;
    if (iVar1 != 0) {
      pcVar2 = outfile1;
    }
    strcpy(netoutfile,pcVar2);
  }
  pcVar2 = strchr(infile,0x3f);
  if (pcVar2 != (char *)0x0) {
    if (*outfile1 != '\0') {
      builtin_strncpy(urltype,"httpfile://",0xc);
      iVar1 = strncmp(outfile1,"file://",7);
      if (iVar1 == 0) {
        outfile1 = outfile1 + 7;
      }
      strcpy(netoutfile,outfile1);
      return 0;
    }
    return 0;
  }
  pcVar2 = strstr(infile,".gz");
  if ((pcVar2 != (char *)0x0) || (pcVar2 = strstr(infile,".Z"), pcVar2 != (char *)0x0))
  goto LAB_00137568;
  sVar3 = strlen(infile);
  if (sVar3 - 0x4ad < 0xfffffffffffffb50) {
    return 0x7d;
  }
  strcpy(local_e38,infile);
  sVar3 = strlen(local_e38);
  builtin_strncpy(local_e38 + sVar3,".gz",4);
  iVar1 = http_open_network(local_e38,(FILE **)&local_e48,(char *)&local_988,local_4d8,&local_e3c);
  if (iVar1 == 0x68) {
LAB_00137861:
    sVar3 = strlen(infile + 2);
    if (0x4af < sVar3) {
      return 0x7d;
    }
    strcpy(local_e38,infile);
    sVar3 = strlen(local_e38);
    (local_e38 + sVar3)[0] = '.';
    (local_e38 + sVar3)[1] = 'Z';
    local_e38[sVar3 + 2] = '\0';
    iVar1 = http_open_network(local_e38,(FILE **)&local_e48,(char *)&local_988,local_4d8,&local_e3c)
    ;
    if (iVar1 == 0) {
      if (CONCAT31((undefined3)uStack_984,local_988._3_1_) == 0x2f2f3a && local_988 == 0x3a707466) {
        iVar1 = ftp_file_exist(local_e38);
        if (0 < iVar1) goto LAB_001377b8;
        goto LAB_00137568;
      }
LAB_001375f6:
      if (local_e48 != (FILE *)0x0) {
        fclose(local_e48);
      }
      sVar3 = strlen(local_e38);
      if (0x400 < sVar3) {
        return 0x7d;
      }
      strcpy(infile,local_e38);
      if (*outfile1 == '\0') {
        return 0;
      }
      iVar1 = strncmp(outfile1,"mem:",4);
      if (iVar1 != 0) {
        pcVar2 = strchr(infile,0x3f);
        if (((pcVar2 == (char *)0x0) &&
            ((pcVar2 = strstr(infile,".gz"), pcVar2 != (char *)0x0 ||
             (pcVar2 = strstr(infile,".Z"), pcVar2 != (char *)0x0)))) &&
           ((pcVar2 = strstr(outfile1,".gz"), pcVar2 != (char *)0x0 ||
            (pcVar2 = strstr(outfile1,".Z"), pcVar2 != (char *)0x0)))) {
          builtin_strncpy(urltype,"httpcompress://",0x10);
          return 0;
        }
        builtin_strncpy(urltype,"httpfile://",0xc);
        return 0;
      }
      uVar4 = 0x3a6d656d70747468;
      goto LAB_00137903;
    }
LAB_00137568:
    strcpy(local_e38,infile);
    iVar1 = http_open_network(local_e38,(FILE **)&local_e48,(char *)&local_988,local_4d8,&local_e3c)
    ;
    if (iVar1 != 0) {
      return 0x68;
    }
    infile_00 = ppFVar5;
    if (CONCAT31((undefined3)uStack_984,local_988._3_1_) != 0x2f2f3a || local_988 != 0x3a707466)
    goto LAB_001375d3;
    iVar1 = ftp_file_exist(local_e38);
    if (iVar1 < 1) {
      return 0x68;
    }
    builtin_strncpy(urltype,"ftp://",7);
    sVar3 = strlen(local_e38);
    if (0x400 < sVar3) {
      return 0x7d;
    }
    strcpy(infile,local_e38);
    if (*outfile1 == '\0') {
      return 0;
    }
    iVar1 = strncmp(outfile1,"mem:",4);
    if (iVar1 == 0) {
LAB_00137979:
      builtin_strncpy(urltype,"ftpmem://",10);
      return 0;
    }
  }
  else {
    if (iVar1 != 0) {
      return iVar1;
    }
    if (CONCAT31((undefined3)uStack_984,local_988._3_1_) != 0x2f2f3a || local_988 != 0x3a707466) {
LAB_001375d3:
      if (local_980 == '\0' && CONCAT44(uStack_984,local_988) == 0x2f2f3a7370747468) {
        https_checkfile(urltype,(char *)infile_00,outfile1);
        return 0;
      }
      goto LAB_001375f6;
    }
    iVar1 = ftp_file_exist(local_e38);
    if (iVar1 < 1) goto LAB_00137861;
LAB_001377b8:
    builtin_strncpy(urltype,"ftp://",7);
    sVar3 = strlen(local_e38);
    if (0x400 < sVar3) {
      return 0x7d;
    }
    strcpy(infile,local_e38);
    if (*outfile1 == '\0') {
      return 0;
    }
    iVar1 = strncmp(outfile1,"mem:",4);
    if (iVar1 == 0) goto LAB_00137979;
    pcVar2 = strstr(outfile1,".gz");
    if ((pcVar2 != (char *)0x0) || (pcVar2 = strstr(outfile1,".Z"), pcVar2 != (char *)0x0)) {
      builtin_strncpy(urltype,"ftpcompress://",0xf);
      return 0;
    }
  }
  uVar4 = 0x3a656c6966707466;
LAB_00137903:
  *(undefined8 *)urltype = uVar4;
  urltype[7] = ':';
  urltype[8] = '/';
  urltype[9] = '/';
  urltype[10] = '\0';
  return 0;
}

Assistant:

int http_checkfile (char *urltype, char *infile, char *outfile1)
{

/* Small helper functions to set the netoutfile static string */
/* Called by cfileio after parsing the output file off of the input file url */

  char newinfile[MAXLEN];
  FILE *httpfile=0;
  char contentencoding[MAXLEN], contenttype[MAXLEN];
  int contentlength;
  int foundfile = 0;
  int status=0;

  /* set defaults  */
  strcpy(urltype,"http://");

  if (strlen(outfile1)) {
    /* don't copy the "file://" prefix, if present.  */
    if (!strncmp(outfile1, "file://", 7) ) {
      strcpy(netoutfile,outfile1+7);
    } else {
      strcpy(netoutfile,outfile1);
    }
  }

  if (strstr(infile, "?")) {
      /* Special case where infile name contains a "?". */
      /* This is probably a CGI string; no point in testing if it exists */
      /*  so just set urltype and netoutfile if necessary, then return */
      
      if (strlen(outfile1)) {   /* was an outfile specified? */
          strcpy(urltype,"httpfile://");  

          /* don't copy the "file://" prefix, if present.  */
          if (!strncmp(outfile1, "file://", 7) ) {
             strcpy(netoutfile,outfile1+7);
          } else {
             strcpy(netoutfile,outfile1);
          }
      }
      return 0;  /* case where infile name contains "?" */
  }

  /*
     If the specified infile file name does not contain a .gz or .Z suffix,
     then first test if a .gz compressed version of the file exists, and if not
     then test if a .Z version of the file exists. (because it will be much
     faster to read the compressed file).  If the compressed files do not exist,
     then finally just open the infile name exactly as specified.
  */

  if (!strstr(infile,".gz") && (!strstr(infile,".Z"))) {
    /* The infile string does not contain the name of a compressed file.  */
    /* Fisrt, look for a .gz compressed version of the file. */
    
    if (strlen(infile) + 3 > MAXLEN-1)
    {
       return URL_PARSE_ERROR;
    }  
    strcpy(newinfile,infile);
    strcat(newinfile,".gz");

    status = http_open_network(newinfile,&httpfile, contentencoding,
			       contenttype, &contentlength);
    if (!status) {
      if (!strcmp(contentencoding, "ftp://")) {
          /* this is a signal from http_open_network that indicates that */
          /* the http server returned a 301 or 302 redirect to a FTP URL. */
          /* Check that the file exists, because redirect many not be reliable */
	   
          if (ftp_file_exist(newinfile)>0) { 
              /* The ftp .gz compressed file is there, all is good!  */
              strcpy(urltype, "ftp://");
              if (strlen(newinfile) > FLEN_FILENAME-1)
              {
                 return URL_PARSE_ERROR;
              }
              strcpy(infile,newinfile);

              if (strlen(outfile1)) {
                /* there is an output file;  might need to modify the urltype */

                if (!strncmp(outfile1, "mem:", 4) )  {
                     /* copy the file to memory, with READ and WRITE access 
                     In this case, it makes no difference whether the ftp file
                     and or the output file are compressed or not.   */

                     strcpy(urltype, "ftpmem://");  /* use special driver */
                } else {
        	    /* input file is compressed */
		    if (strstr(outfile1,".gz") || (strstr(outfile1,".Z"))) {
		      strcpy(urltype,"ftpcompress://");
		    } else {
		      strcpy(urltype,"ftpfile://");
		    }
                } 
              }

              return 0;   /* found the .gz compressed ftp file */
	    }
            /* fall through to here if ftp redirect does not exist */
      } else if (!strcmp(contentencoding, "https://")) {
          /* the http server returned a 301 or 302 redirect to an HTTPS URL. */
          https_checkfile(urltype, infile, outfile1);
          /* For https we're not testing for compressed extensions at 
             this stage.  It will all be done in https_open_network.  Therefore
             leave infile alone and do immediate return. */
          return 0;
      } else {
          /* found the http .gz compressed file */
          if (httpfile)
             fclose(httpfile);
          foundfile = 1;
          if (strlen(newinfile) > FLEN_FILENAME-1)
          {
             return URL_PARSE_ERROR;
          }
          strcpy(infile,newinfile);
      }
    }
    else if (status != FILE_NOT_OPENED)
    {
       /* Some other error occured aside from not finding file, such as
          a url parsing error.  Don't continue trying with other extensions. */
       return status;   
    }

   if (!foundfile) {
    /* did not find .gz compressed version of the file, so look for .Z file. */
    
    if (strlen(infile+2) > MAXLEN-1)
    {
       return URL_PARSE_ERROR;
    }  
    strcpy(newinfile,infile);
    strcat(newinfile,".Z");
    if (!http_open_network(newinfile,&httpfile, contentencoding,
			   contenttype, &contentlength)) {

      if (!strcmp(contentencoding, "ftp://")) {
          /* this is a signal from http_open_network that indicates that */
          /* the http server returned a 301 or 302 redirect to a FTP URL. */
          /* Check that the file exists, because redirect many not be reliable */
	   
          if (ftp_file_exist(newinfile)>0) { 
              /* The ftp .Z compressed file is there, all is good!  */
              strcpy(urltype, "ftp://");
              if (strlen(newinfile) > FLEN_FILENAME-1)
              {
                 return URL_PARSE_ERROR;
              }
              strcpy(infile,newinfile);

              if (strlen(outfile1)) {
                /* there is an output file;  might need to modify the urltype */

                if (!strncmp(outfile1, "mem:", 4) )  {
                     /* copy the file to memory, with READ and WRITE access 
                     In this case, it makes no difference whether the ftp file
                     and or the output file are compressed or not.   */

                     strcpy(urltype, "ftpmem://");  /* use special driver */
                } else {
        	    /* input file is compressed */
		    if (strstr(outfile1,".gz") || (strstr(outfile1,".Z"))) {
		      strcpy(urltype,"ftpcompress://");
		    } else {
		      strcpy(urltype,"ftpfile://");
		    }
                } 
            }
            return 0;   /* found the .Z compressed ftp file */
          }
          /* fall through to here if ftp redirect does not exist */
        }  else {
           /* found the http .Z compressed file */
           if (httpfile)
              fclose(httpfile);
           foundfile = 1;
           if (strlen(newinfile) > FLEN_FILENAME-1)
           {
              return URL_PARSE_ERROR;
           }
           strcpy(infile,newinfile);
        }
      }
    }
  }  /* end of case where infile does not contain .gz or .Z */

  if (!foundfile) {
    /* look for the base file.name */
      
    strcpy(newinfile,infile);
    if (!http_open_network(newinfile,&httpfile, contentencoding,
			   contenttype, &contentlength)) {

      if (!strcmp(contentencoding, "ftp://")) {
          /* this is a signal from http_open_network that indicates that */
          /* the http server returned a 301 or 302 redirect to a FTP URL. */
          /* Check that the file exists, because redirect many not be reliable */
	   
          if (ftp_file_exist(newinfile)>0) { 
              /* The ftp file is there, all is good!  */
              strcpy(urltype, "ftp://");
              if (strlen(newinfile) > FLEN_FILENAME-1)
              {
                 return URL_PARSE_ERROR;
              }
              strcpy(infile,newinfile);

              if (strlen(outfile1)) {
                /* there is an output file;  might need to modify the urltype */

                if (!strncmp(outfile1, "mem:", 4) )  {
                     /* copy the file to memory, with READ and WRITE access 
                     In this case, it makes no difference whether the ftp file
                     and or the output file are compressed or not.   */

                     strcpy(urltype, "ftpmem://");  /* use special driver */
                     return 0;
                } else {

        	  /* input file is not compressed */
		   strcpy(urltype,"ftpfile://");
                } 
              } 
              return 0;   /* found the ftp file */
            }
            /* fall through to here if ftp redirect does not exist */
      } else if (!strcmp(contentencoding, "https://")) {
          /* the http server returned a 301 or 302 redirect to an HTTPS URL. */
          https_checkfile(urltype, infile, outfile1);
          /* For https we're not testing for compressed extensions at 
             this stage.  It will all be done in https_open_network.  Therefore
             leave infile alone and do immediate return. */
          return 0;
      }  else {
          /* found the base named file */
          if (httpfile)
             fclose(httpfile);
          foundfile = 1;
          if (strlen(newinfile) > FLEN_FILENAME-1)
          {
             return URL_PARSE_ERROR;
          }
          strcpy(infile,newinfile);
      }

    }
  }

  if (!foundfile) {
     return (FILE_NOT_OPENED);
  }

  if (strlen(outfile1)) {
    /* there is an output file */

    if (!strncmp(outfile1, "mem:", 4) )  {
       /* copy the file to memory, with READ and WRITE access 
          In this case, it makes no difference whether the http file
          and or the output file are compressed or not.   */

       strcpy(urltype, "httpmem://");  /* use special driver */
       return 0;
    }

    if (strstr(infile, "?")) {
      /* file name contains a '?' so probably a cgi string;  */
      strcpy(urltype,"httpfile://");
      return 0;
    }

    if (strstr(infile,".gz") || (strstr(infile,".Z"))) {
	/* It's compressed */
	if (strstr(outfile1,".gz") || (strstr(outfile1,".Z"))) {
	  strcpy(urltype,"httpcompress://");
	} else {
	  strcpy(urltype,"httpfile://");
	}
    } else {
	strcpy(urltype,"httpfile://");
    }
  } 
  return 0;
}